

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args,PyObject *kwargs)

{
  PyTypeObject *pPVar1;
  undefined8 *puVar2;
  uint uVar3;
  PyObject *pPVar4;
  PyObject *pPVar5;
  int iVar6;
  uint uVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long *plVar10;
  type_info *ptVar11;
  undefined8 *puVar12;
  key_type *pkVar13;
  object *poVar14;
  error_already_set *this;
  key_type **ppkVar15;
  key_type **ppkVar16;
  size_type *psVar17;
  ulong uVar18;
  uint __len;
  PyObject *pPVar19;
  long lVar20;
  ulong uVar21;
  key_type *pkVar22;
  long lVar23;
  string sig;
  tuple args_;
  uint __uval;
  tuple args__1;
  string local_118;
  handle local_f8;
  long local_f0;
  PyObject local_e8;
  PyObject *local_d8;
  accessor<pybind11::detail::accessor_policies::tuple_item> local_d0;
  ulong local_b0;
  undefined8 *local_a8;
  handle local_a0 [2];
  PyObject local_90;
  long local_80;
  handle local_78 [2];
  PyObject *local_68;
  handle local_60;
  long local_58;
  PyObject local_50;
  PyObject *local_40;
  PyTypeObject *local_38;
  
  puVar8 = (undefined8 *)PyCapsule_GetPointer(self,0);
  if ((args->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                  ,0x184,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  local_b0 = args[1].ob_refcnt;
  local_d8 = kwargs;
  if (kwargs == (PyObject *)0x0) {
    local_80 = 0;
  }
  else {
    local_80 = PyDict_Size(kwargs);
  }
  if (local_b0 == 0) {
    local_38 = (PyTypeObject *)0x0;
  }
  else {
    if ((args->ob_type->tp_flags & 0x4000000) == 0) {
      __assert_fail("PyTuple_Check(args)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                    ,0x187,
                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                   );
    }
    local_38 = args[1].ob_type;
  }
  pPVar19 = (PyObject *)0x1;
  pPVar5 = args;
  local_a8 = puVar8;
  uVar21 = local_b0;
  pPVar4 = local_68;
  for (; local_68 = pPVar5, puVar8 != (undefined8 *)0x0; puVar8 = (undefined8 *)puVar8[0xf]) {
    if (args != (PyObject *)0x0) {
      args->ob_refcnt = args->ob_refcnt + 1;
    }
    uVar18 = ((long)(puVar8[4] - puVar8[3]) >> 3) * -0x5555555555555555;
    local_f8.m_ptr = args;
    if (uVar21 < uVar18) {
      tuple::tuple((tuple *)&local_118,uVar18);
      object::operator=((object *)&local_f8,(object *)&local_118);
      object::~object((object *)&local_118);
      if (uVar21 != 0) {
        uVar9 = 0;
        do {
          if ((args->ob_type->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                          ,0x19a,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          pPVar1 = (&args[1].ob_type)[uVar9];
          if (pPVar1 != (PyTypeObject *)0x0) {
            (pPVar1->ob_base).ob_base.ob_refcnt = (pPVar1->ob_base).ob_base.ob_refcnt + 1;
          }
          if (((local_f8.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args_.ptr())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                          ,0x19b,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          (&local_f8.m_ptr[1].ob_type)[uVar9] = pPVar1;
          uVar9 = uVar9 + 1;
        } while (uVar21 != uVar9);
      }
      puVar12 = (undefined8 *)puVar8[3];
      puVar2 = (undefined8 *)puVar8[4];
      if (puVar12 == puVar2) {
        lVar23 = 0;
        args = local_68;
        uVar21 = local_b0;
      }
      else {
        lVar20 = 0x18;
        lVar23 = 0;
        local_40 = pPVar19;
        do {
          if (((local_f8.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args_.ptr())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                          ,0x1a1,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          iVar6 = 9;
          if (*(long *)((long)&(local_f8.m_ptr)->ob_refcnt + lVar20) == 0) {
            if (local_d8 == (PyObject *)0x0) {
              plVar10 = (long *)0x0;
            }
            else {
              plVar10 = (long *)PyDict_GetItemString(local_d8,*puVar12);
            }
            if (plVar10 == (long *)0x0) {
              if (puVar12[2] != 0) {
                plVar10 = (long *)puVar12[2];
              }
            }
            else {
              lVar23 = lVar23 + 1;
            }
            if (plVar10 == (long *)0x0) {
              lVar23 = -1;
              iVar6 = 8;
            }
            else {
              *plVar10 = *plVar10 + 1;
              if (((local_f8.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_.ptr())",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                              ,0x1ae,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              *(long **)((long)&(local_f8.m_ptr)->ob_refcnt + lVar20) = plVar10;
              iVar6 = 0;
            }
          }
          args = local_68;
          pPVar19 = local_40;
          uVar21 = local_b0;
          if ((iVar6 != 9) && (iVar6 != 0)) break;
          puVar12 = puVar12 + 3;
          lVar20 = lVar20 + 8;
        } while (puVar12 != puVar2);
      }
    }
    else {
      lVar23 = 0;
      uVar18 = uVar21;
    }
    if (((lVar23 == local_80) || ((*(byte *)((long)puVar8 + 0x59) & 0x10) != 0)) &&
       ((uVar18 == *(ushort *)((long)puVar8 + 0x5a) || ((*(byte *)((long)puVar8 + 0x59) & 8) != 0)))
       ) {
      pPVar19 = (PyObject *)(*(code *)puVar8[6])(puVar8,local_f8.m_ptr,local_d8,local_38);
    }
    object::~object((object *)&local_f8);
    pPVar4 = local_68;
    if (pPVar19 != (PyObject *)0x1) break;
    pPVar5 = local_68;
  }
  local_68 = pPVar4;
  puVar8 = local_a8;
  if (pPVar19 == (PyObject *)0x0) {
    local_f8.m_ptr = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "Unable to convert function return value to a Python type! The signature was\n\t","")
    ;
    std::__cxx11::string::append((char *)&local_f8);
    PyErr_SetString(_PyExc_TypeError,local_f8.m_ptr);
    if (local_f8.m_ptr == &local_e8) {
      return (PyObject *)0x0;
    }
    goto LAB_001109f7;
  }
  if (pPVar19 != (PyObject *)0x1) {
    if ((*(byte *)((long)local_a8 + 0x59) & 1) == 0) {
      return pPVar19;
    }
    if ((args->ob_type->tp_flags & 0x4000000) == 0) {
      __assert_fail("PyTuple_Check(args)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/pybind11.h"
                    ,0x215,
                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                   );
    }
    pPVar1 = args[1].ob_type;
    ptVar11 = detail::get_type_info((pPVar1->ob_base).ob_base.ob_type);
    (*ptVar11->init_holder)((PyObject *)pPVar1,(void *)0x0);
    return pPVar19;
  }
  if ((*(byte *)((long)local_a8 + 0x59) & 4) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string((string *)local_a0,(char *)*local_a8,(allocator *)local_78);
  plVar10 = (long *)std::__cxx11::string::append((char *)local_a0);
  ppkVar16 = (key_type **)&local_d0.key;
  ppkVar15 = (key_type **)(plVar10 + 2);
  if ((key_type **)*plVar10 == ppkVar15) {
    local_d0.key = (key_type)*ppkVar15;
    local_d0.cache.super_handle.m_ptr = (handle)plVar10[3];
    local_d0._0_8_ = ppkVar16;
  }
  else {
    local_d0.key = (key_type)*ppkVar15;
    local_d0._0_8_ = (key_type **)*plVar10;
  }
  local_d0.obj.m_ptr = (PyObject *)plVar10[1];
  *plVar10 = (long)ppkVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  iVar6 = 0x118954;
  if ((*(byte *)((long)puVar8 + 0x59) & 1) != 0) {
    iVar6 = 0x118948;
  }
  local_60.m_ptr = &local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,iVar6,iVar6 + (*(byte *)((long)puVar8 + 0x59) & 1) * 3 + 8);
  pkVar22 = (key_type *)((long)&(local_d0.obj.m_ptr)->ob_refcnt + local_58);
  pkVar13 = (key_type *)0xf;
  if ((key_type **)local_d0._0_8_ != ppkVar16) {
    pkVar13 = (key_type *)local_d0.key;
  }
  if (pkVar13 < pkVar22) {
    pkVar13 = (key_type *)0xf;
    if (local_60.m_ptr != &local_50) {
      pkVar13 = (key_type *)local_50.ob_refcnt;
    }
    if (pkVar13 < pkVar22) goto LAB_0011045a;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,local_d0._0_8_);
  }
  else {
LAB_0011045a:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_60.m_ptr);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar17 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar17) {
    local_118.field_2._M_allocated_capacity = *psVar17;
    local_118.field_2._8_8_ = puVar8[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar17;
    local_118._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_118._M_string_length = puVar8[1];
  *puVar8 = psVar17;
  puVar8[1] = 0;
  *(undefined1 *)psVar17 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_f8.m_ptr = &local_e8;
  pPVar19 = (PyObject *)(plVar10 + 2);
  if ((PyObject *)*plVar10 == pPVar19) {
    local_e8.ob_refcnt = pPVar19->ob_refcnt;
    local_e8.ob_type = (PyTypeObject *)plVar10[3];
  }
  else {
    local_e8.ob_refcnt = pPVar19->ob_refcnt;
    local_f8.m_ptr = (PyObject *)*plVar10;
  }
  local_f0 = plVar10[1];
  *plVar10 = (long)pPVar19;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_60.m_ptr != &local_50) {
    operator_delete(local_60.m_ptr,local_50.ob_refcnt + 1);
  }
  if ((key_type **)local_d0._0_8_ != ppkVar16) {
    operator_delete((void *)local_d0._0_8_,local_d0.key + 1);
  }
  if (local_a0[0].m_ptr != &local_90) {
    operator_delete(local_a0[0].m_ptr,local_90.ob_refcnt + 1);
  }
  local_d8 = (PyObject *)0x0;
  puVar8 = local_a8;
  do {
    uVar3 = (uint)local_d8;
    local_d8 = (PyObject *)(ulong)(uVar3 + 1);
    __len = 1;
    if (8 < uVar3) {
      pPVar19 = local_d8;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar7 = (uint)pPVar19;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_001105fd;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_001105fd;
        }
        if (uVar7 < 10000) goto LAB_001105fd;
        pPVar19 = (PyObject *)((ulong)pPVar19 / 10000);
        uVar3 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_001105fd:
    local_a0[0].m_ptr = &local_90;
    std::__cxx11::string::_M_construct((ulong)local_a0,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0[0].m_ptr,__len,(uint)local_d8);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x118996);
    ppkVar16 = (key_type **)(plVar10 + 2);
    if ((key_type **)*plVar10 == ppkVar16) {
      local_d0.key = (key_type)*ppkVar16;
      local_d0.cache.super_handle.m_ptr = (handle)plVar10[3];
      local_d0._0_8_ = &local_d0.key;
    }
    else {
      local_d0.key = (key_type)*ppkVar16;
      local_d0._0_8_ = (key_type **)*plVar10;
    }
    local_d0.obj.m_ptr = (PyObject *)plVar10[1];
    *plVar10 = (long)ppkVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar17 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_118.field_2._M_allocated_capacity = *psVar17;
      local_118.field_2._8_8_ = puVar12[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar17;
      local_118._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_118._M_string_length = puVar12[1];
    *puVar12 = psVar17;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((key_type *)local_d0._0_8_ != &local_d0.key) {
      operator_delete((void *)local_d0._0_8_,local_d0.key + 1);
    }
    if (local_a0[0].m_ptr != &local_90) {
      operator_delete(local_a0[0].m_ptr,local_90.ob_refcnt + 1);
    }
    if ((*(byte *)((long)local_a8 + 0x59) & 1) == 0) {
LAB_0011087a:
      std::__cxx11::string::append((char *)&local_f8);
    }
    else {
      std::__cxx11::string::string((string *)&local_118,(char *)puVar8[2],(allocator *)&local_d0);
      lVar23 = std::__cxx11::string::find((char)&local_118,0x28);
      uVar21 = lVar23 + 7;
      if (local_118._M_string_length <= uVar21) {
LAB_0011085a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0011087a;
      }
      uVar18 = std::__cxx11::string::find((char *)&local_118,0x11899b,0);
      local_80 = std::__cxx11::string::rfind((char *)&local_118,0x11899e,0xffffffffffffffff);
      if (uVar18 < local_118._M_string_length) {
        uVar9 = uVar18 + 2;
      }
      else {
        uVar9 = std::__cxx11::string::find((char)&local_118,0x29);
        uVar18 = uVar9;
      }
      if ((uVar18 <= uVar21) || (local_118._M_string_length <= uVar9)) goto LAB_0011085a;
      std::__cxx11::string::append((string *)&local_f8,(ulong)&local_118,uVar21);
      std::__cxx11::string::push_back((char)(string *)&local_f8);
      std::__cxx11::string::append((string *)&local_f8,(ulong)&local_118,uVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_f8);
    puVar8 = (undefined8 *)puVar8[0xf];
  } while (puVar8 != (undefined8 *)0x0);
  std::__cxx11::string::append((char *)&local_f8);
  if (args != (PyObject *)0x0) {
    args->ob_refcnt = args->ob_refcnt + 1;
  }
  pkVar22 = (key_type *)(ulong)(*(byte *)((long)local_a8 + 0x59) & 1);
  local_a0[0].m_ptr = args;
  while (pkVar13 = (key_type *)PyTuple_Size(local_a0[0].m_ptr), pkVar22 < pkVar13) {
    local_d0.obj.m_ptr = local_a0[0].m_ptr;
    local_d0.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    local_d0.key = (key_type)pkVar22;
    poVar14 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        (&local_d0);
    local_78[0].m_ptr = (poVar14->super_handle).m_ptr;
    if (local_78[0].m_ptr != (PyObject *)0x0) {
      (local_78[0].m_ptr)->ob_refcnt = (local_78[0].m_ptr)->ob_refcnt + 1;
    }
    pPVar19 = (PyObject *)PyObject_Repr(local_78[0].m_ptr);
    if (pPVar19 == (PyObject *)0x0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_60.m_ptr = pPVar19;
    str::operator_cast_to_string(&local_118,(str *)&local_60);
    std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_118._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    object::~object((object *)&local_60);
    object::~object((object *)local_78);
    object::~object(&local_d0.cache);
    pkVar13 = (key_type *)PyTuple_Size(local_a0[0].m_ptr);
    pkVar22 = (key_type *)((long)pkVar22 + 1);
    if (pkVar22 != pkVar13) {
      std::__cxx11::string::append((char *)&local_f8);
    }
  }
  PyErr_SetString(_PyExc_TypeError,local_f8.m_ptr);
  object::~object((object *)local_a0);
  if (local_f8.m_ptr == &local_e8) {
    return (PyObject *)0x0;
  }
LAB_001109f7:
  operator_delete(local_f8.m_ptr,local_e8.ob_refcnt + 1);
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args, PyObject *kwargs) {
        /* Iterator over the list of potentially admissible overloads */
        detail::function_record *overloads = (detail::function_record *) PyCapsule_GetPointer(self, nullptr),
                                *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        size_t nargs = (size_t) PyTuple_GET_SIZE(args),
               nkwargs = kwargs ? (size_t) PyDict_Size(kwargs) : 0;

        handle parent = nargs > 0 ? PyTuple_GET_ITEM(args, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;
        try {
            for (; it != nullptr; it = it->next) {
                auto args_ = reinterpret_borrow<tuple>(args);
                size_t kwargs_consumed = 0;

                /* For each overload:
                   1. If the required list of arguments is longer than the
                      actually provided amount, create a copy of the argument
                      list and fill in any available keyword/default arguments.
                   2. Ensure that all keyword arguments were "consumed"
                   3. Call the function call dispatcher (function_record::impl)
                 */
                size_t nargs_ = nargs;
                if (nargs < it->args.size()) {
                    nargs_ = it->args.size();
                    args_ = tuple(nargs_);
                    for (size_t i = 0; i < nargs; ++i) {
                        handle item = PyTuple_GET_ITEM(args, i);
                        PyTuple_SET_ITEM(args_.ptr(), i, item.inc_ref().ptr());
                    }

                    int arg_ctr = 0;
                    for (auto const &it2 : it->args) {
                        int index = arg_ctr++;
                        if (PyTuple_GET_ITEM(args_.ptr(), index))
                            continue;

                        handle value;
                        if (kwargs)
                            value = PyDict_GetItemString(kwargs, it2.name);

                        if (value)
                            kwargs_consumed++;
                        else if (it2.value)
                            value = it2.value;

                        if (value) {
                            PyTuple_SET_ITEM(args_.ptr(), index, value.inc_ref().ptr());
                        } else {
                            kwargs_consumed = (size_t) -1; /* definite failure */
                            break;
                        }
                    }
                }

                try {
                    if ((kwargs_consumed == nkwargs || it->has_kwargs) &&
                        (nargs_ == it->nargs || it->has_args))
                        result = it->impl(it, args_, kwargs, parent);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = pybind11::detail::get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (detail::function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args);
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                msg += pybind11::repr(args_[ti]);
                if ((ti + 1) != args_.size() )
                    msg += ", ";
            }
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                /* When a constructor ran successfully, the corresponding
                   holder type (e.g. std::unique_ptr) must still be initialized. */
                PyObject *inst = PyTuple_GET_ITEM(args, 0);
                auto tinfo = detail::get_type_info(Py_TYPE(inst));
                tinfo->init_holder(inst, nullptr);
            }
            return result.ptr();
        }
    }